

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock(ThreadSafeArena *this,void *buf,size_t size)

{
  size_t sVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  LogMessage local_50;
  Voidify local_3d;
  uint local_3c;
  unsigned_long local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t size_local;
  void *buf_local;
  ThreadSafeArena *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)size;
  size_local = (size_t)buf;
  buf_local = this;
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue((ulong)buf & 7);
  local_3c = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_30 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                       (&local_38,&local_3c,"reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
               ,0x23e,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_3d,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  if ((size_local == 0) || (absl_log_internal_check_op_result < (Nullable<const_char_*>)0x11)) {
    this_local = (ThreadSafeArena *)anon_unknown_12::SentryArenaBlock();
  }
  else {
    if (absl_log_internal_check_op_result != (Nullable<const_char_*>)0x0) {
      *(undefined1 *)size_local = 0;
      absl_log_internal_check_op_result[size_local - 1] = '\0';
    }
    TaggedAllocationPolicyPtr::set_is_user_owned_initial_block(&this->alloc_policy_,true);
    sVar1 = size_local;
    ArenaBlock::ArenaBlock
              ((ArenaBlock *)size_local,(ArenaBlock *)0x0,(size_t)absl_log_internal_check_op_result)
    ;
    this_local = (ThreadSafeArena *)sVar1;
  }
  return (ArenaBlock *)this_local;
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size) {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);
  if (buf == nullptr || size <= kBlockHeaderSize) {
    return SentryArenaBlock();
  }
  // Record user-owned block.

  if constexpr (internal::PerformDebugChecks()) {
    // Touch block to verify it is addressable.
    if (size > 0) {
      static_cast<char*>(buf)[0] = 0;
      static_cast<char*>(buf)[size - 1] = 0;
    }
  }

  ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(buf, size);
  alloc_policy_.set_is_user_owned_initial_block(true);
  return new (buf) ArenaBlock{nullptr, size};
}